

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRle.cpp
# Opt level: O0

void anon_unknown.dwarf_214610::testRoundTrip(int bufferLen)

{
  int iVar1;
  char *pcVar2;
  signed *psVar3;
  char *pcVar4;
  int in_EDI;
  int i;
  int compressedLen;
  char *test;
  char *compressed;
  char *src;
  undefined8 in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  int local_28;
  
  pcVar2 = (char *)operator_new__((long)in_EDI);
  psVar3 = (signed *)operator_new__((long)(in_EDI << 1));
  pcVar4 = (char *)operator_new__((long)in_EDI);
  generateData(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  iVar1 = Imf_3_4::rleCompress(in_EDI,pcVar2,psVar3);
  iVar1 = Imf_3_4::rleUncompress(iVar1,in_EDI,psVar3,pcVar4);
  if (iVar1 < 1) {
    __assert_fail("rleUncompress (compressedLen, bufferLen, compressed, test) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testRle.cpp"
                  ,0x45,"void (anonymous namespace)::testRoundTrip(int)");
  }
  local_28 = 0;
  while( true ) {
    if (in_EDI <= local_28) {
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
      }
      if (psVar3 != (signed *)0x0) {
        operator_delete__(psVar3);
      }
      if (pcVar4 != (char *)0x0) {
        operator_delete__(pcVar4);
      }
      return;
    }
    if (pcVar2[local_28] != pcVar4[local_28]) break;
    local_28 = local_28 + 1;
  }
  __assert_fail("src[i] == test[i]",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testRle.cpp"
                ,0x49,"void (anonymous namespace)::testRoundTrip(int)");
}

Assistant:

void
testRoundTrip (int bufferLen)
{
    char*        src        = new char[bufferLen];
    signed char* compressed = new signed char[2 * bufferLen];
    char*        test       = new char[bufferLen];

    generateData (src, bufferLen);

    int compressedLen = rleCompress (bufferLen, src, compressed);

    assert (rleUncompress (compressedLen, bufferLen, compressed, test) > 0);

    for (int i = 0; i < bufferLen; ++i)
    {
        assert (src[i] == test[i]);
    }

    delete[] src;
    delete[] compressed;
    delete[] test;
}